

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

void __thiscall
ot::commissioner::DtlsSession::HandshakeTimerCallback(DtlsSession *this,Timer *param_1)

{
  bool bVar1;
  Error local_c8;
  Error local_a0;
  Error local_68;
  undefined1 local_40 [8];
  Error error;
  Timer *param_1_local;
  DtlsSession *this_local;
  
  error.mMessage.field_2._8_8_ = param_1;
  Error::Error((Error *)local_40);
  if (this->mState != kConnecting) {
    abort();
  }
  Handshake(&local_68,this);
  Error::operator=((Error *)local_40,&local_68);
  Error::~Error(&local_68);
  Error::Error(&local_a0,(Error *)local_40);
  bVar1 = ShouldStop(&local_a0);
  Error::~Error(&local_a0);
  if (bVar1) {
    Error::Error(&local_c8,(Error *)local_40);
    Disconnect(this,&local_c8);
    Error::~Error(&local_c8);
  }
  Error::~Error((Error *)local_40);
  return;
}

Assistant:

void DtlsSession::HandshakeTimerCallback(Timer &)
{
    Error error;

    switch (mState)
    {
    case State::kConnecting:
        error = Handshake();
        break;

    case State::kConnected:
    default:
        VerifyOrDie(false);
    }

    if (ShouldStop(error))
    {
        Disconnect(error);
    }
}